

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O1

int cpu_exec_tricore(uc_struct_conflict15 *uc,CPUState *cpu)

{
  uc_struct_conflict7 *puVar1;
  void *pvVar2;
  CPUWatchpoint *pCVar3;
  CPUClass *pCVar4;
  TranslationBlock *pTVar5;
  long lVar6;
  undefined8 uVar7;
  _func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *p_Var8;
  _func_void_CPUState_ptr_vaddr_conflict *p_Var9;
  _Bool _Var10;
  byte bVar11;
  int iVar12;
  uint uVar13;
  TranslationBlock *pTVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  TranslationBlock_conflict *pTVar18;
  TranslationBlock_conflict *pTVar19;
  uint uVar20;
  uint cf_mask;
  uint32_t cflags;
  CPUClass *pCVar21;
  TranslationBlock_conflict *pTVar22;
  uc_struct_conflict15 *puVar23;
  list_item *plVar24;
  bool bVar25;
  uc_tb cur_tb;
  ulong local_50;
  undefined2 local_48;
  undefined2 local_46;
  ulong local_40;
  uint16_t local_38;
  uint16_t local_36;
  
  pCVar21 = cpu->cc;
  if (cpu->halted != 0) {
    if (pCVar21->has_work == (_func__Bool_CPUState_ptr_conflict *)0x0) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                 ,0x1bc,"cc->has_work");
    }
    _Var10 = (*pCVar21->has_work)((CPUState_conflict *)cpu);
    if (!_Var10) {
      return 0x10003;
    }
    cpu->halted = 0;
  }
  (*pCVar21->cpu_exec_enter)((CPUState_conflict *)cpu);
  iVar12 = __sigsetjmp(uc->exits + (long)uc->nested_level * 0x19 + 0x33,0);
  puVar23 = uc;
  if (iVar12 != 0) {
    pCVar21 = cpu->cc;
  }
  do {
    uVar17 = (uint)puVar23;
    puVar1 = cpu->uc;
    if ((puVar1->stop_interrupt == (uc_args_int_t_conflict7)0x0) ||
       (_Var10 = (*puVar1->stop_interrupt)(puVar1,cpu->exception_index), !_Var10)) {
      uVar20 = cpu->exception_index;
      if ((int)uVar20 < 0) {
        bVar25 = false;
      }
      else if ((int)uVar20 < 0x10000) {
        bVar25 = false;
        for (plVar24 = puVar1->hook[0].head;
            (plVar24 != (list_item *)0x0 && (pvVar2 = plVar24->data, pvVar2 != (void *)0x0));
            plVar24 = plVar24->next) {
          if (*(char *)((long)pvVar2 + 0x14) == '\0') {
            (**(code **)((long)pvVar2 + 0x28))
                      (puVar1,cpu->exception_index,*(undefined8 *)((long)pvVar2 + 0x30));
            bVar25 = true;
          }
        }
        if (bVar25) {
          cpu->exception_index = -1;
          uVar17 = 0x10000;
        }
        else {
          puVar1->invalid_error = 0x15;
          cpu->halted = 1;
          uVar17 = 0x10001;
        }
        bVar25 = (bool)(bVar25 ^ 1);
      }
      else {
        if (uVar20 == 0x10002) {
          pCVar4 = cpu->cc;
          if (cpu->watchpoint_hit == (CPUWatchpoint *)0x0) {
            for (pCVar3 = (cpu->watchpoints).tqh_first; pCVar3 != (CPUWatchpoint *)0x0;
                pCVar3 = (pCVar3->entry).tqe_next) {
              *(byte *)&pCVar3->flags = (byte)pCVar3->flags & 0x3f;
            }
          }
          (*pCVar4->debug_excp_handler)((CPUState_conflict *)cpu);
        }
        cpu->exception_index = -1;
        bVar25 = true;
        uVar17 = uVar20;
      }
    }
    else {
      plVar24 = puVar1->hook[0xe].head;
      if (plVar24 == (list_item *)0x0) {
LAB_00d1a824:
        puVar1->invalid_error = 10;
      }
      else {
        bVar11 = 0;
        while (pvVar2 = plVar24->data, pvVar2 != (void *)0x0) {
          if (((*(char *)((long)pvVar2 + 0x14) == '\0') &&
              (bVar11 = (**(code **)((long)pvVar2 + 0x28))
                                  (puVar1,*(undefined8 *)((long)pvVar2 + 0x30)), bVar11 != 0)) ||
             (plVar24 = plVar24->next, plVar24 == (list_item *)0x0)) break;
        }
        if ((bVar11 & 1) == 0) goto LAB_00d1a824;
      }
      bVar25 = true;
      uVar17 = 0x10001;
    }
    if (bVar25) {
      uc->cpu->tcg_exit_req = 0;
      (*pCVar21->cpu_exec_exit)((CPUState_conflict *)cpu);
      return uVar17;
    }
    pTVar19 = (TranslationBlock_conflict *)0x0;
    pTVar18 = pTVar19;
LAB_00d1a92f:
    pCVar4 = cpu->cc;
    *(undefined2 *)((long)cpu[1].tb_jmp_cache + 0x72a) = 0;
    uVar20 = cpu->interrupt_request;
    if (uVar20 == 0) {
LAB_00d1a94a:
      if (cpu->exit_request == true) {
        cpu->exit_request = false;
        bVar25 = true;
        if (cpu->exception_index == -1) {
          cpu->exception_index = 0x10000;
        }
      }
      else {
        bVar25 = false;
      }
    }
    else {
      uVar13 = uVar20;
      if ((cpu->singlestep_enabled & 2) != 0) {
        uVar13 = uVar20 & 0xffffeda5;
      }
      if ((char)uVar13 < '\0') {
        cpu->interrupt_request = uVar20 & 0xffffff7f;
        cpu->exception_index = 0x10002;
      }
      else {
        if ((uVar13 >> 10 & 1) == 0) {
          _Var10 = (*pCVar4->cpu_exec_interrupt)((CPUState_conflict *)cpu,uVar13);
          if (_Var10) {
            cpu->exception_index = -1;
            pTVar18 = (TranslationBlock_conflict *)0x0;
          }
          if ((cpu->interrupt_request & 4) != 0) {
            cpu->interrupt_request = cpu->interrupt_request & 0xfffffffb;
            pTVar18 = (TranslationBlock_conflict *)0x0;
          }
          goto LAB_00d1a94a;
        }
        cpu_reset(cpu);
      }
      bVar25 = true;
    }
    if (!bVar25) {
      cflags = cpu->cflags_next_tb;
      if (cflags == 0xffffffff) {
        cflags = 0;
      }
      else {
        cpu->cflags_next_tb = 0xffffffff;
      }
      puVar1 = cpu->uc;
      uVar20 = *(uint *)((long)cpu->env_ptr + 0x9c);
      uVar13 = uVar20 >> 8 ^ uVar20;
      uVar13 = uVar13 & 0x3f | uVar13 >> 8 & 0xfc0;
      pTVar14 = cpu->tb_jmp_cache[uVar13];
      cf_mask = cpu->cluster_index << 0x18 | cflags & 0xffffff;
      if ((((pTVar14 == (TranslationBlock *)0x0) || ((uint)pTVar14->pc != uVar20)) ||
          ((*(target_ulong_conflict *)((long)&pTVar14->pc + 4) != 0 ||
           (((uint32_t)pTVar14->cs_base != 0 ||
            (cpu->trace_dstate[0] != (ulong)*(uint *)&pTVar14->size)))))) ||
         ((pTVar14->flags & 0xff0effff) != cf_mask)) {
        pTVar14 = tb_htable_lookup_tricore(cpu,(ulong)uVar20,0,0,cf_mask);
        if (pTVar14 == (TranslationBlock *)0x0) {
          pTVar14 = (TranslationBlock *)0x0;
        }
        else {
          cpu->tb_jmp_cache[uVar13] = pTVar14;
        }
      }
      if (pTVar14 == (TranslationBlock *)0x0) {
        pTVar14 = (TranslationBlock *)tb_gen_code_tricore(cpu,uVar20,0,0,cflags);
        cpu->tb_jmp_cache[uVar13] = pTVar14;
        pTVar5 = puVar1->last_tb;
        if (pTVar5 != (TranslationBlock *)0x0) {
          local_40 = (ulong)(uint)pTVar14->pc;
          local_38 = *(uint16_t *)((long)&pTVar14->cs_base + 6);
          local_36 = *(uint16_t *)((long)&pTVar14->cs_base + 4);
          local_50 = (ulong)(uint)pTVar5->pc;
          local_48 = *(undefined2 *)((long)&pTVar5->cs_base + 6);
          local_46 = *(undefined2 *)((long)&pTVar5->cs_base + 4);
          for (plVar24 = puVar1->hook[0xf].head;
              (plVar24 != (list_item *)0x0 && (pvVar2 = plVar24->data, pvVar2 != (void *)0x0));
              plVar24 = plVar24->next) {
            if (*(char *)((long)pvVar2 + 0x14) == '\0') {
              uVar15 = (ulong)(uint)pTVar14->pc;
              if (((*(ulong *)((long)pvVar2 + 0x18) <= uVar15) &&
                  (uVar15 <= *(ulong *)((long)pvVar2 + 0x20))) ||
                 (*(ulong *)((long)pvVar2 + 0x20) < *(ulong *)((long)pvVar2 + 0x18))) {
                (**(code **)((long)pvVar2 + 0x28))
                          (puVar1,&local_40,&local_50,*(undefined8 *)((long)pvVar2 + 0x30));
              }
            }
          }
        }
      }
      if ((pTVar18 != (TranslationBlock_conflict *)0x0) &&
         (pTVar14->page_addr[0] == 0xffffffffffffffff)) {
        if (1 < (uint)pTVar19) {
          __assert_fail("n < ARRAY_SIZE(tb->jmp_list_next)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                        ,0xda,"void tb_add_jump(TranslationBlock *, int, TranslationBlock *)");
        }
        if ((pTVar14->flags & 0x40000) == 0) {
          LOCK();
          bVar25 = pTVar18->jmp_dest[(long)pTVar19] == 0;
          if (bVar25) {
            pTVar18->jmp_dest[(long)pTVar19] = (uintptr_t)pTVar14;
          }
          UNLOCK();
          if (bVar25) {
            pvVar2 = (pTVar18->tc).ptr;
            *(int *)(pTVar18->jmp_target_arg[(long)pTVar19] + (long)pvVar2) =
                 (*(int *)&((tb_tc *)&pTVar14->cflags)->ptr -
                 ((int)pTVar18->jmp_target_arg[(long)pTVar19] + (int)pvVar2)) + -4;
            pTVar18->jmp_list_next[(long)pTVar19] = pTVar14->jmp_target_arg[1];
            pTVar14->jmp_target_arg[1] = (ulong)pTVar18 | (ulong)pTVar19;
          }
        }
      }
      if (cpu->exit_request == false) {
        pvVar2 = cpu->env_ptr;
        tb_exec_lock_tricore((TCGContext_conflict9 *)cpu->uc->tcg_ctx);
        uVar15 = (**(code **)(*(long *)(*(long *)((long)pvVar2 + 0x2c8) + 0x2e8) + 0x90))(pvVar2);
        if (cpu->uc->nested_level == 1) {
          tb_exec_unlock_tricore((TCGContext_conflict9 *)cpu->uc->tcg_ctx);
        }
        cpu->can_do_io = 1;
        pTVar22 = (TranslationBlock_conflict *)(uVar15 & 0xfffffffffffffffc);
        if ((uVar15 & 2) != 0) {
          if (*(long *)(*(long *)((long)pvVar2 + 0x2c8) + 0x358) == 0) {
            uVar20 = *(uint *)(*(long *)((long)pvVar2 + 0x2c8) + 0x578);
            if (((0x12 < uVar20) || ((0x771c0U >> (uVar20 & 0x1f) & 1) == 0)) &&
               (cpu->uc->quit_request == false)) {
              p_Var8 = cpu->cc->synchronize_from_tb;
              if (p_Var8 == (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x0) {
                p_Var9 = cpu->cc->set_pc;
                if (p_Var9 == (_func_void_CPUState_ptr_vaddr_conflict *)0x0) goto LAB_00d1af27;
                (*p_Var9)((CPUState_conflict *)cpu,(ulong)pTVar22->pc);
              }
              else {
                (*p_Var8)((CPUState_conflict *)cpu,pTVar22);
              }
            }
          }
          cpu->tcg_exit_req = 0;
        }
        cpu->uc->last_tb = pTVar14;
        uVar20 = (uint)uVar15 & 3;
        pTVar19 = (TranslationBlock_conflict *)(ulong)uVar20;
        pTVar18 = pTVar22;
        if (uVar20 == 3) {
          pTVar18 = (TranslationBlock_conflict *)0x0;
          pTVar19 = (TranslationBlock_conflict *)0x3;
          if (-1 < *(int *)(cpu[1].tb_jmp_cache + 0xe5)) {
            lVar6 = cpu->icount_budget;
            lVar16 = 0xffff;
            if (lVar6 < 0xffff) {
              lVar16 = lVar6;
            }
            uVar20 = (uint)lVar16;
            *(short *)(cpu[1].tb_jmp_cache + 0xe5) = (short)lVar16;
            cpu->icount_extra = lVar6 - (int)uVar20;
            pTVar18 = (TranslationBlock_conflict *)0x0;
            pTVar19 = (TranslationBlock_conflict *)0x3;
            if (0 < (int)uVar20 && lVar6 - (int)uVar20 == 0) {
              uVar13 = 0x7fff;
              if ((int)uVar20 < 0x7fff) {
                uVar13 = uVar20;
              }
              pTVar14 = (TranslationBlock *)
                        tb_gen_code_tricore(cpu,pTVar22->pc,pTVar22->cs_base,pTVar22->flags,
                                            uVar13 | 0x10000);
              (pTVar14->tc).size = (size_t)pTVar22;
              pvVar2 = cpu->env_ptr;
              uVar7._0_4_ = pTVar14->cflags;
              uVar7._4_4_ = pTVar14->trace_vcpu_dstate;
              tb_exec_lock_tricore((TCGContext_conflict9 *)cpu->uc->tcg_ctx);
              uVar15 = (**(code **)(*(long *)(*(long *)((long)pvVar2 + 0x2c8) + 0x2e8) + 0x90))
                                 (pvVar2,uVar7);
              if (cpu->uc->nested_level == 1) {
                tb_exec_unlock_tricore((TCGContext_conflict9 *)cpu->uc->tcg_ctx);
              }
              cpu->can_do_io = 1;
              if ((uVar15 & 2) != 0) {
                if (*(long *)(*(long *)((long)pvVar2 + 0x2c8) + 0x358) == 0) {
                  uVar20 = *(uint *)(*(long *)((long)pvVar2 + 0x2c8) + 0x578);
                  if (((0x12 < uVar20) || ((0x771c0U >> (uVar20 & 0x1f) & 1) == 0)) &&
                     (cpu->uc->quit_request == false)) {
                    p_Var8 = cpu->cc->synchronize_from_tb;
                    if (p_Var8 == (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x0) {
                      p_Var9 = cpu->cc->set_pc;
                      if (p_Var9 == (_func_void_CPUState_ptr_vaddr_conflict *)0x0) {
LAB_00d1af27:
                        __assert_fail("cc->set_pc",
                                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                                      ,0x61,
                                      "tcg_target_ulong cpu_tb_exec(CPUState *, TranslationBlock *)"
                                     );
                      }
                      (*p_Var9)((CPUState_conflict *)cpu,
                                (ulong)((TranslationBlock_conflict *)(uVar15 & 0xfffffffffffffffc))
                                       ->pc);
                    }
                    else {
                      (*p_Var8)((CPUState_conflict *)cpu,
                                (TranslationBlock_conflict *)(uVar15 & 0xfffffffffffffffc));
                    }
                  }
                }
                cpu->tcg_exit_req = 0;
              }
              tb_phys_invalidate_tricore
                        ((TCGContext_conflict9 *)cpu->uc->tcg_ctx,
                         (TranslationBlock_conflict *)pTVar14,0xffffffffffffffff);
              tcg_tb_remove_tricore((TCGContext_conflict9 *)cpu->uc->tcg_ctx,pTVar14);
              pTVar18 = (TranslationBlock_conflict *)0x0;
              pTVar19 = (TranslationBlock_conflict *)0x3;
            }
          }
        }
      }
      goto LAB_00d1a92f;
    }
    puVar23 = (uc_struct_conflict15 *)(ulong)uVar17;
  } while( true );
}

Assistant:

int cpu_exec(struct uc_struct *uc, CPUState *cpu)
{
    CPUClass *cc = CPU_GET_CLASS(cpu);
    int ret;
    // SyncClocks sc = { 0 };

    if (cpu_handle_halt(cpu)) {
        return EXCP_HALTED;
    }

    // rcu_read_lock();

    cc->cpu_exec_enter(cpu);

    /* Calculate difference between guest clock and host clock.
     * This delay includes the delay of the last cycle, so
     * what we have to do is sleep until it is 0. As for the
     * advance/delay we gain here, we try to fix it next time.
     */
    // init_delay_params(&sc, cpu);

    // Unicorn: We would like to support nested uc_emu_start calls.
    /* prepare setjmp context for exception handling */
    // if (sigsetjmp(cpu->jmp_env, 0) != 0) {
    if (sigsetjmp(uc->jmp_bufs[uc->nested_level - 1], 0) != 0) {
#if defined(__clang__) || !QEMU_GNUC_PREREQ(4, 6)
        /* Some compilers wrongly smash all local variables after
         * siglongjmp. There were bug reports for gcc 4.5.0 and clang.
         * Reload essential local variables here for those compilers.
         * Newer versions of gcc would complain about this code (-Wclobbered). */
        cc = CPU_GET_CLASS(cpu);
#else /* buggy compiler */
        /* Assert that the compiler does not smash local variables. */
        // g_assert(cpu == current_cpu);
        g_assert(cc == CPU_GET_CLASS(cpu));
#endif /* buggy compiler */

        assert_no_pages_locked();
    }

    /* if an exception is pending, we execute it here */
    while (!cpu_handle_exception(cpu, &ret)) {
        TranslationBlock *last_tb = NULL;
        int tb_exit = 0;

        while (!cpu_handle_interrupt(cpu, &last_tb)) {
            uint32_t cflags = cpu->cflags_next_tb;
            TranslationBlock *tb;

            /* When requested, use an exact setting for cflags for the next
               execution.  This is used for icount, precise smc, and stop-
               after-access watchpoints.  Since this request should never
               have CF_INVALID set, -1 is a convenient invalid value that
               does not require tcg headers for cpu_common_reset.  */
            if (cflags == -1) {
                cflags = curr_cflags();
            } else {
                cpu->cflags_next_tb = -1;
            }

            tb = tb_find(cpu, last_tb, tb_exit, cflags);
            if (unlikely(cpu->exit_request)) {
                continue;
            }
            cpu_loop_exec_tb(cpu, tb, &last_tb, &tb_exit);
            /* Try to align the host and virtual clocks
               if the guest is in advance */
            // align_clocks(&sc, cpu);
        }
    }

    // Unicorn: Clear any TCG exit flag that might have been left set by exit requests
    uc->cpu->tcg_exit_req = 0;

    cc->cpu_exec_exit(cpu);
    // rcu_read_unlock();

    return ret;
}